

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void init_mc_flow_dispenser(AV1_COMP *cpi,int frame_idx,int pframe_qindex)

{
  int iVar1;
  int iVar2;
  aom_tune_metric in_EDX;
  int in_ESI;
  AV1_COMP *in_RDI;
  int layer_depth_th;
  FRAME_UPDATE_TYPE update_type;
  BitDepthInfo bd_info;
  int base_qindex;
  MB_MODE_INFO *mbmi_ptr;
  MB_MODE_INFO mbmi;
  MV_REFERENCE_FRAME refs [2];
  int i;
  TplDepFrame *tpl_ref_frame;
  FRAME_TYPE frame_type;
  int layer_depth;
  int boost_index;
  TplTxfmStats *tpl_txfm_stats;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  ThreadData *td;
  int idx;
  int rdmult;
  AV1_COMMON *cm;
  int ref_frame_flags;
  int gop_length;
  int ref_pruning_enabled;
  TPL_SPEED_FEATURES *tpl_sf;
  GF_GROUP *gf_group;
  uint32_t ref_frame_display_indices [7];
  YV12_BUFFER_CONFIG *ref_frames_ordered [7];
  YV12_BUFFER_CONFIG *this_frame;
  TplDepFrame *tpl_frame;
  TplParams *tpl_data;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  uint in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  FRAME_TYPE frame_type_00;
  int in_stack_fffffffffffffe04;
  bool bVar3;
  undefined4 in_stack_fffffffffffffe08;
  aom_tune_metric layer_depth_00;
  undefined4 in_stack_fffffffffffffe0c;
  FRAME_UPDATE_TYPE update_type_00;
  undefined4 in_stack_fffffffffffffe10;
  aom_bit_depth_t bit_depth;
  undefined4 in_stack_fffffffffffffe14;
  int qindex;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  aom_tune_metric qindex_00;
  aom_tune_metric tuning;
  SPEED_FEATURES *sf;
  aom_bit_depth_t in_stack_fffffffffffffe30;
  int local_1cc;
  int local_1c8;
  MB_MODE_INFO *local_1b0;
  MB_MODE_INFO local_1a8;
  char local_f6;
  undefined1 local_f5;
  int local_f4;
  TplDepFrame *local_f0;
  FRAME_TYPE local_e1;
  int local_e0;
  int local_dc;
  TplTxfmStats *local_d8;
  MACROBLOCKD *local_d0;
  ThreadData *local_c8;
  ThreadData *local_c0;
  int local_b8;
  int local_b4;
  AV1_COMMON *local_b0;
  uint local_a4;
  int local_a0;
  int local_9c;
  TPL_SPEED_FEATURES *local_98;
  GF_GROUP *local_90;
  uint32_t local_88 [8];
  YV12_BUFFER_CONFIG *local_68 [8];
  YV12_BUFFER_CONFIG *local_28;
  TplDepFrame *local_20;
  TplParams *local_18;
  aom_tune_metric local_10;
  int local_c;
  AV1_COMP *local_8;
  
  local_18 = &in_RDI->ppi->tpl_data;
  local_20 = (in_RDI->ppi->tpl_data).tpl_frame + in_ESI;
  local_28 = local_20->gf_picture;
  local_90 = &in_RDI->ppi->gf_group;
  local_98 = &(in_RDI->sf).tpl_sf;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_9c = is_frame_eligible_for_ref_pruning
                       ((GF_GROUP *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                        in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,0);
  local_a0 = get_gop_length(local_90);
  local_b0 = &local_8->common;
  local_c8 = &local_8->td;
  local_d0 = &(local_8->td).mb.e_mbd;
  local_d8 = &(local_8->td).tpl_txfm_stats;
  local_18->frame_idx = local_c;
  local_c0 = local_c8;
  tpl_reset_src_ref_frames(local_18);
  av1_tile_init((TileInfo *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                (AV1_COMMON *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),0,
                0x32a185);
  if ((local_8->ppi->p_rc).gfu_boost / 100 < 0x10) {
    local_1c8 = (local_8->ppi->p_rc).gfu_boost / 100;
  }
  else {
    local_1c8 = 0xf;
  }
  local_dc = local_1c8;
  if (local_90->layer_depth[local_8->gf_frame_index] < 6) {
    local_1cc = local_90->layer_depth[local_8->gf_frame_index];
  }
  else {
    local_1cc = 6;
  }
  local_e0 = local_1cc;
  local_e1 = (local_b0->current_frame).frame_type;
  av1_setup_scale_factors_for_frame
            ((scale_factors *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,0,0x32a289);
  local_d0->cur_buf = local_28;
  for (local_b8 = 0; local_b8 < 7; local_b8 = local_b8 + 1) {
    local_f0 = local_18->tpl_frame + local_20->ref_map_index[local_b8];
    local_18->ref_frame[local_b8] = local_f0->rec_picture;
    local_18->src_ref_frame[local_b8] = local_f0->gf_picture;
    local_88[local_b8] = local_f0->frame_display_index;
  }
  for (local_f4 = 0; local_f4 < 7; local_f4 = local_f4 + 1) {
    local_68[local_f4] = local_18->ref_frame["\x01\a\x05\x04\x06\x02\x03"[local_f4] + -1];
  }
  sf = &local_8->sf;
  iVar1 = is_one_pass_rt_params
                    ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  local_a4 = get_ref_frame_flags(sf,iVar1,local_68,(local_8->ext_flags).ref_frame_flags);
  enforce_max_ref_frames
            ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             (int *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             (uint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdfc);
  for (local_b8 = 0; local_b8 < 7; local_b8 = local_b8 + 1) {
    if ((local_a4 & 1 << ((byte)local_b8 & 0x1f)) == 0) {
      local_18->ref_frame[local_b8] = (YV12_BUFFER_CONFIG *)0x0;
    }
  }
  if ((local_9c != 0) && (local_c < local_a0)) {
    for (local_b8 = 0; local_b8 < 7; local_b8 = local_b8 + 1) {
      local_f6 = (char)local_b8 + '\x01';
      local_f5 = 0xff;
      iVar1 = prune_ref_by_selective_ref_frame
                        ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
                         ,(MV_REFERENCE_FRAME *)
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                         (uint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      if (iVar1 != 0) {
        local_18->ref_frame[local_b8] = (YV12_BUFFER_CONFIG *)0x0;
      }
    }
  }
  frame_type_00 = (FRAME_TYPE)((uint)in_stack_fffffffffffffe00 >> 0x18);
  memset(&local_1a8,0,0xb0);
  local_1b0 = &local_1a8;
  local_d0->mi = &local_1b0;
  local_d0->block_ref_scale_factors[0] = &local_18->sf;
  local_d0->block_ref_scale_factors[1] = &local_18->sf;
  qindex_00 = local_10;
  if (local_8->use_ducky_encode != 0) {
    qindex_00 = local_90->q_val[local_c];
  }
  update_type_00 = (FRAME_UPDATE_TYPE)(local_b0->seq_params->bit_depth >> 0x18);
  bit_depth = CONCAT13((local_8->ppi->gf_group).update_type[local_8->gf_frame_index],
                       (int3)in_stack_fffffffffffffe10);
  iVar1 = (local_8->oxcf).q_cfg.use_fixed_qp_offsets;
  layer_depth_00 = qindex_00;
  qindex = local_e0;
  tuning = qindex_00;
  iVar2 = is_stat_consumption_stage
                    ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  local_b4 = av1_compute_rd_mult(qindex,bit_depth,update_type_00,layer_depth_00,
                                 in_stack_fffffffffffffe04,frame_type_00,iVar1,(int)sf,
                                 in_stack_fffffffffffffe30);
  if (local_b4 < 1) {
    local_b4 = 1;
  }
  av1_set_error_per_bit(&(local_c8->mb).errorperbit,local_b4);
  av1_set_sad_per_bit(local_8,&(local_c8->mb).sadperbit,qindex_00);
  local_20->is_valid = '\x01';
  (local_b0->quant_params).base_qindex = qindex_00;
  av1_frame_init_quantizer((AV1_COMP *)CONCAT44(in_stack_fffffffffffffdf4,iVar2));
  get_bit_depth_info((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffdec,iVar1));
  iVar1 = av1_compute_rd_mult_based_on_qindex
                    (in_stack_fffffffffffffe30,(FRAME_UPDATE_TYPE)((ulong)sf >> 0x38),(int)sf,tuning
                    );
  local_20->base_rdmult = iVar1 / 6;
  if (local_8->use_ducky_encode != 0) {
    local_20->base_rdmult = local_90->rdmult_val[local_c];
  }
  av1_init_tpl_txfm_stats((TplTxfmStats *)0x32a7e3);
  if (local_98->allow_compound_pred != 0) {
    memset(&(local_c8->mb).mbmi_ext,0,0x504);
  }
  local_d0->mi = (MB_MODE_INFO **)0x0;
  iVar1 = 0;
  if (local_98->use_sad_for_mode_decision == 1) {
    iVar1 = 5;
  }
  bVar3 = false;
  if ((local_98->use_sad_for_mode_decision != 0) &&
     (bVar3 = false, local_90->update_type[local_8->gf_frame_index] != '\0')) {
    bVar3 = iVar1 <= local_90->layer_depth[local_c];
  }
  local_20->use_pred_sad = (uint)bVar3;
  return;
}

Assistant:

static inline void init_mc_flow_dispenser(AV1_COMP *cpi, int frame_idx,
                                          int pframe_qindex) {
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[frame_idx];
  const YV12_BUFFER_CONFIG *this_frame = tpl_frame->gf_picture;
  const YV12_BUFFER_CONFIG *ref_frames_ordered[INTER_REFS_PER_FRAME];
  uint32_t ref_frame_display_indices[INTER_REFS_PER_FRAME];
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  TPL_SPEED_FEATURES *tpl_sf = &cpi->sf.tpl_sf;
  int ref_pruning_enabled = is_frame_eligible_for_ref_pruning(
      gf_group, cpi->sf.inter_sf.selective_ref_frame,
      tpl_sf->prune_ref_frames_in_tpl, frame_idx);
  int gop_length = get_gop_length(gf_group);
  int ref_frame_flags;
  AV1_COMMON *cm = &cpi->common;
  int rdmult, idx;
  ThreadData *td = &cpi->td;
  MACROBLOCK *x = &td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  TplTxfmStats *tpl_txfm_stats = &td->tpl_txfm_stats;
  tpl_data->frame_idx = frame_idx;
  tpl_reset_src_ref_frames(tpl_data);
  av1_tile_init(&xd->tile, cm, 0, 0);

  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;

  // Setup scaling factor
  av1_setup_scale_factors_for_frame(
      &tpl_data->sf, this_frame->y_crop_width, this_frame->y_crop_height,
      this_frame->y_crop_width, this_frame->y_crop_height);

  xd->cur_buf = this_frame;

  for (idx = 0; idx < INTER_REFS_PER_FRAME; ++idx) {
    TplDepFrame *tpl_ref_frame =
        &tpl_data->tpl_frame[tpl_frame->ref_map_index[idx]];
    tpl_data->ref_frame[idx] = tpl_ref_frame->rec_picture;
    tpl_data->src_ref_frame[idx] = tpl_ref_frame->gf_picture;
    ref_frame_display_indices[idx] = tpl_ref_frame->frame_display_index;
  }

  // Store the reference frames based on priority order
  for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
    ref_frames_ordered[i] =
        tpl_data->ref_frame[ref_frame_priority_order[i] - 1];
  }

  // Work out which reference frame slots may be used.
  ref_frame_flags =
      get_ref_frame_flags(&cpi->sf, is_one_pass_rt_params(cpi),
                          ref_frames_ordered, cpi->ext_flags.ref_frame_flags);

  enforce_max_ref_frames(cpi, &ref_frame_flags, ref_frame_display_indices,
                         tpl_frame->frame_display_index);

  // Prune reference frames
  for (idx = 0; idx < INTER_REFS_PER_FRAME; ++idx) {
    if ((ref_frame_flags & (1 << idx)) == 0) {
      tpl_data->ref_frame[idx] = NULL;
    }
  }

  // Skip motion estimation w.r.t. reference frames which are not
  // considered in RD search, using "selective_ref_frame" speed feature.
  // The reference frame pruning is not enabled for frames beyond the gop
  // length, as there are fewer reference frames and the reference frames
  // differ from the frames considered during RD search.
  if (ref_pruning_enabled && (frame_idx < gop_length)) {
    for (idx = 0; idx < INTER_REFS_PER_FRAME; ++idx) {
      const MV_REFERENCE_FRAME refs[2] = { idx + 1, NONE_FRAME };
      if (prune_ref_by_selective_ref_frame(cpi, NULL, refs,
                                           ref_frame_display_indices)) {
        tpl_data->ref_frame[idx] = NULL;
      }
    }
  }

  // Make a temporary mbmi for tpl model
  MB_MODE_INFO mbmi;
  memset(&mbmi, 0, sizeof(mbmi));
  MB_MODE_INFO *mbmi_ptr = &mbmi;
  xd->mi = &mbmi_ptr;

  xd->block_ref_scale_factors[0] = &tpl_data->sf;
  xd->block_ref_scale_factors[1] = &tpl_data->sf;

  const int base_qindex =
      cpi->use_ducky_encode ? gf_group->q_val[frame_idx] : pframe_qindex;
  // The TPL model is only meant to be run in inter mode, so ensure that we are
  // not running in all intra mode, which implies we are not tuning for image
  // quality (IQ) or SSIMULACRA2.
  assert(cpi->oxcf.tune_cfg.tuning != AOM_TUNE_IQ &&
         cpi->oxcf.tune_cfg.tuning != AOM_TUNE_SSIMULACRA2 &&
         cpi->oxcf.mode != ALLINTRA);
  // Get rd multiplier set up.
  rdmult = av1_compute_rd_mult(
      base_qindex, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);

  if (rdmult < 1) rdmult = 1;
  av1_set_error_per_bit(&x->errorperbit, rdmult);
  av1_set_sad_per_bit(cpi, &x->sadperbit, base_qindex);

  tpl_frame->is_valid = 1;

  cm->quant_params.base_qindex = base_qindex;
  av1_frame_init_quantizer(cpi);

  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  const FRAME_UPDATE_TYPE update_type =
      gf_group->update_type[cpi->gf_frame_index];
  tpl_frame->base_rdmult = av1_compute_rd_mult_based_on_qindex(
                               bd_info.bit_depth, update_type, base_qindex,
                               cpi->oxcf.tune_cfg.tuning) /
                           6;

  if (cpi->use_ducky_encode)
    tpl_frame->base_rdmult = gf_group->rdmult_val[frame_idx];

  av1_init_tpl_txfm_stats(tpl_txfm_stats);

  // Initialize x->mbmi_ext when compound predictions are enabled.
  if (tpl_sf->allow_compound_pred) av1_zero(x->mbmi_ext);

  // Set the pointer to null since mbmi is only allocated inside this function.
  assert(xd->mi == &mbmi_ptr);
  xd->mi = NULL;

  // Tpl module is called before the setting of speed features at frame level.
  // Thus, turning off this speed feature for key frame is done here and not
  // integrated into the speed feature setting itself.
  const int layer_depth_th = (tpl_sf->use_sad_for_mode_decision == 1) ? 5 : 0;
  tpl_frame->use_pred_sad =
      tpl_sf->use_sad_for_mode_decision &&
      gf_group->update_type[cpi->gf_frame_index] != KF_UPDATE &&
      gf_group->layer_depth[frame_idx] >= layer_depth_th;
}